

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O1

void use_shared_pointer(void)

{
  undefined8 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  long lVar4;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pwin;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  local_90[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"The Iron Man","");
  local_90[1] = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_80,pbVar2);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"The amazing four","");
  local_78 = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_70,pbVar2);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"Capital America","");
  local_68 = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_60,pbVar2);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"The spiderman","");
  local_58 = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&local_50,pbVar2);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"The superman","");
  local_48 = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (local_40,pbVar2);
  pbVar2 = local_68;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_a0,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mavel movies are:\n",0x16);
  lVar4 = 0;
  do {
    puVar1 = *(undefined8 **)((long)local_90 + lVar4 + 8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar1,puVar1[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The winner is ",0xe);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!\n",2);
  if (a_Stack_a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_a0[0]._M_pi);
  }
  lVar4 = 0x50;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_90 + lVar4) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_90 + lVar4));
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != 0);
  return;
}

Assistant:

void use_shared_pointer() {
    using namespace std;

    shared_ptr<string> films[5] = {
            shared_ptr<string>(new string("The Iron Man")),
            shared_ptr<string>(new string("The amazing four")),
            shared_ptr<string>(new string("Capital America")),
            shared_ptr<string>(new string("The spiderman")),
            shared_ptr<string>(new string("The superman")),
    };

    shared_ptr<string> pwin;
    //  point to same string, reference count ++
    pwin = films[2];

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}